

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::NotEquals,true,false,true,true>
                (hugeint_t *ldata,hugeint_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  uint64_t uVar4;
  long lVar5;
  sel_t *psVar6;
  bool bVar7;
  idx_t iVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  sel_t sVar12;
  ulong uVar13;
  ulong uVar14;
  unsigned_long uVar15;
  int64_t *piVar16;
  bool bVar17;
  
  if (count + 0x3f < 0x40) {
    iVar8 = 0;
  }
  else {
    puVar1 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar8 = 0;
    lVar11 = 0;
    uVar10 = 0;
    uVar14 = 0;
    do {
      if (puVar1 == (unsigned_long *)0x0) {
        uVar15 = 0xffffffffffffffff;
      }
      else {
        uVar15 = puVar1[uVar10];
      }
      uVar13 = uVar14 + 0x40;
      if (count <= uVar14 + 0x40) {
        uVar13 = count;
      }
      uVar9 = uVar14;
      if (uVar15 == 0xffffffffffffffff) {
        if (uVar14 < uVar13) {
          psVar2 = sel->sel_vector;
          uVar4 = ldata->lower;
          lVar5 = ldata->upper;
          psVar3 = true_sel->sel_vector;
          psVar6 = false_sel->sel_vector;
          piVar16 = &rdata[uVar14].upper;
          do {
            uVar9 = uVar14;
            if (psVar2 != (sel_t *)0x0) {
              uVar9 = (ulong)psVar2[uVar14];
            }
            bVar17 = *piVar16 == lVar5;
            bVar7 = ((hugeint_t *)(piVar16 + -1))->lower == uVar4;
            psVar3[iVar8] = (sel_t)uVar9;
            iVar8 = iVar8 + (!bVar17 || !bVar7);
            psVar6[lVar11] = (sel_t)uVar9;
            lVar11 = lVar11 + (ulong)(bVar17 && bVar7);
            uVar14 = uVar14 + 1;
            piVar16 = piVar16 + 2;
            uVar9 = uVar14;
          } while (uVar13 != uVar14);
        }
      }
      else if (uVar15 == 0) {
        uVar9 = uVar13;
        if (uVar14 < uVar13) {
          psVar2 = sel->sel_vector;
          psVar3 = false_sel->sel_vector;
          do {
            sVar12 = (sel_t)uVar14;
            if (psVar2 != (sel_t *)0x0) {
              sVar12 = psVar2[uVar14];
            }
            psVar3[lVar11] = sVar12;
            lVar11 = lVar11 + 1;
            uVar14 = uVar14 + 1;
          } while (uVar13 != uVar14);
        }
      }
      else if (uVar14 < uVar13) {
        psVar2 = sel->sel_vector;
        psVar3 = true_sel->sel_vector;
        psVar6 = false_sel->sel_vector;
        piVar16 = &rdata[uVar14].upper;
        uVar9 = 0;
        do {
          if (psVar2 == (sel_t *)0x0) {
            sVar12 = (int)uVar14 + (int)uVar9;
          }
          else {
            sVar12 = psVar2[uVar14 + uVar9];
          }
          if ((uVar15 >> (uVar9 & 0x3f) & 1) == 0) {
            bVar17 = false;
          }
          else {
            bVar17 = ldata->upper != *piVar16 ||
                     ldata->lower != ((hugeint_t *)(piVar16 + -1))->lower;
          }
          psVar3[iVar8] = sVar12;
          iVar8 = iVar8 + bVar17;
          psVar6[lVar11] = sVar12;
          lVar11 = lVar11 + (ulong)(bVar17 ^ 1);
          uVar9 = uVar9 + 1;
          piVar16 = piVar16 + 2;
        } while ((uVar14 - uVar13) + uVar9 != 0);
        uVar9 = uVar14 + uVar9;
      }
      uVar10 = uVar10 + 1;
      uVar14 = uVar9;
    } while (uVar10 != count + 0x3f >> 6);
  }
  return iVar8;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}